

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* generate_list<trng::lagfib2plus<unsigned_int,168u,521u>>
            (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             *__return_storage_ptr__,lagfib2plus<unsigned_int,_168U,_521U> *r1,
            lagfib2plus<unsigned_int,_168U,_521U> *r2,long N,long skip1,long skip2)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long i;
  long lVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v1;
  result_type_conflict local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  _Tuple_impl<0ul,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
  *local_40;
  long local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_40 = (_Tuple_impl<0ul,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_58,N);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_78,N);
    lVar6 = 0;
    do {
      uVar4 = (r1->S).index;
      uVar3 = uVar4 + 1 & 0x3ff;
      (r1->S).index = uVar3;
      local_7c = (r1->S).r[uVar4 + 0x1f8 & 0x3ff] + (r1->S).r[uVar4 + 0x359 & 0x3ff];
      (r1->S).r[uVar3] = local_7c;
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_7c;
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar4 = (r2->S).index;
      uVar3 = uVar4 + 1 & 0x3ff;
      (r2->S).index = uVar3;
      local_7c = (r2->S).r[uVar4 + 0x1f8 & 0x3ff] + (r2->S).r[uVar4 + 0x359 & 0x3ff];
      (r2->S).r[uVar3] = local_7c;
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_7c;
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        uVar5 = (ulong)(r1->S).index;
        lVar2 = skip1;
        do {
          iVar1 = (int)uVar5;
          uVar4 = iVar1 + 1U & 0x3ff;
          uVar5 = (ulong)uVar4;
          (r1->S).r[uVar5] = (r1->S).r[iVar1 + 0x1f8U & 0x3ff] + (r1->S).r[iVar1 + 0x359U & 0x3ff];
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
        (r1->S).index = uVar4;
      }
      if (0 < skip2) {
        uVar5 = (ulong)(r2->S).index;
        lVar2 = skip2;
        do {
          iVar1 = (int)uVar5;
          uVar4 = iVar1 + 1U & 0x3ff;
          uVar5 = (ulong)uVar4;
          (r2->S).r[uVar5] = (r2->S).r[iVar1 + 0x1f8U & 0x3ff] + (r2->S).r[iVar1 + 0x359U & 0x3ff];
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
        (r2->S).index = uVar4;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_38);
  }
  std::
  _Tuple_impl<0ul,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
  ::
  _Tuple_impl<std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,void>
            (local_40,&local_58,&local_78);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          *)local_40;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}